

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O3

bool __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_>::
normalize_rec(miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_> *this,
             spectrum *lspec,uint v)

{
  int iVar1;
  pointer psVar2;
  pointer psVar3;
  key_type kVar4;
  undefined1 extraout_AL;
  uint uVar5;
  spectral_operation sVar6;
  iterator __begin2;
  int *piVar7;
  iterator iVar8;
  pointer piVar9;
  pointer __n;
  int *piVar10;
  long lVar11;
  undefined4 in_register_00000014;
  ulong uVar12;
  uint i;
  ulong uVar13;
  uint uVar14;
  uint j;
  key_type *__k;
  char *this_00;
  spectrum *psVar15;
  int iVar16;
  int iVar17;
  vector<int,_std::allocator<int>_> *__range2;
  bool bVar18;
  __hashtable *__h;
  undefined8 local_70;
  miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_> *local_68;
  uint local_60;
  uint local_5c;
  ulong local_58;
  spectrum *local_50;
  ulong local_48;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_kitty::detail::spectrum>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  ulong local_38;
  
  uVar12 = CONCAT44(in_register_00000014,v);
  uVar5 = this->step_counter + 1;
  this->step_counter = uVar5;
  if (uVar5 == this->step_limit) {
LAB_00104d32:
    bVar18 = false;
  }
  else {
    if (this->num_vars_exp == v) {
      if ((this->hasOutputNegation == true) &&
         (piVar7 = (lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start, *piVar7 < 0)) {
        piVar10 = (lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (; piVar7 != piVar10; piVar7 = piVar7 + 1) {
          *piVar7 = -*piVar7;
        }
        uVar12 = local_70 >> 0x20;
        local_70 = CONCAT44((uint)uVar12 & 0xffff0000,3);
        insert(this,(spectral_operation *)&local_70);
        uVar12 = (ulong)this->num_vars_exp;
      }
      if ((1 < (uint)uVar12 & this->hasInputNegation) == 1) {
        uVar13 = 1;
        do {
          kVar4 = local_70;
          uVar5 = (uint)uVar13;
          piVar9 = (lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (piVar9[uVar13] < 0) {
            lVar11 = (long)(lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar9;
            if (lVar11 != 0) {
              uVar12 = 0;
              do {
                if (((uint)uVar12 & uVar5) != 0) {
                  piVar9[uVar12] = -piVar9[uVar12];
                }
                uVar12 = uVar12 + 1;
              } while ((uVar12 & 0xffffffff) < (ulong)(lVar11 >> 2));
            }
            local_70._6_2_ = SUB82(kVar4,6);
            local_70._0_6_ = (spectral_operation)CONCAT24(0,uVar5 << 0x10 | 2);
            insert(this,(spectral_operation *)&local_70);
            uVar12 = (ulong)this->num_vars_exp;
          }
          uVar13 = (ulong)(uVar5 * 2);
        } while (uVar5 * 2 < (uint)uVar12);
      }
      closer(this,(UI *)lspec);
    }
    else {
      piVar9 = (lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = (lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      piVar7 = piVar9 + v;
      local_50 = lspec;
      if (piVar7 != piVar10) {
        iVar16 = 0;
        do {
          iVar1 = *piVar7;
          iVar17 = -iVar1;
          if (0 < iVar1) {
            iVar17 = iVar1;
          }
          if (iVar17 <= iVar16) {
            iVar17 = iVar16;
          }
          iVar16 = iVar17;
          piVar7 = piVar7 + 1;
        } while (piVar7 != piVar10);
        if (iVar16 != 0) {
          if (4 < (ulong)((long)piVar10 - (long)piVar9)) {
            local_60 = -v;
            local_40 = &(this->specs)._M_h;
            uVar13 = (ulong)(v * 2);
            local_38 = 1;
            local_68 = this;
            local_58 = uVar12;
            local_48 = uVar13;
            do {
              __k = &local_70;
              uVar5 = (this->order).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[local_38];
              iVar1 = piVar9[uVar5];
              iVar17 = -iVar1;
              if (0 < iVar1) {
                iVar17 = iVar1;
              }
              if ((iVar17 == iVar16) && (uVar14 = uVar5 & local_60, uVar14 != 0)) {
                local_70 = uVar13;
                iVar8 = std::
                        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_kitty::detail::spectrum>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::find(local_40,__k);
                if (iVar8.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_kitty::detail::spectrum>,_false>
                    ._M_cur == (__node_type *)0x0) goto LAB_00105048;
                psVar15 = (spectrum *)
                          ((long)iVar8.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_kitty::detail::spectrum>,_false>
                                 ._M_cur + 0x10);
                if (psVar15 != lspec) {
                  std::vector<int,_std::allocator<int>_>::operator=
                            ((vector<int,_std::allocator<int>_> *)psVar15,&lspec->_s);
                }
                uVar14 = -uVar14 & uVar14;
                local_5c = local_68->transform_index;
                if (uVar14 != uVar5) {
                  uVar5 = uVar5 ^ uVar14;
                  do {
                    j = -uVar5 & uVar5;
                    sVar6 = spectrum::spectral_translation(psVar15,uVar14,j);
                    local_70 = CONCAT26(local_70._6_2_,sVar6);
                    insert(local_68,(spectral_operation *)&local_70);
                    bVar18 = j != uVar5;
                    uVar5 = j ^ uVar5;
                  } while (bVar18);
                }
                if (uVar14 != (uint)local_58) {
                  sVar6 = spectrum::permutation(psVar15,uVar14,(uint)local_58);
                  local_70 = CONCAT26(local_70._6_2_,sVar6);
                  insert(local_68,(spectral_operation *)&local_70);
                }
                uVar13 = local_48;
                this = local_68;
                bVar18 = normalize_rec(local_68,psVar15,(uint)local_48);
                if (!bVar18) goto LAB_00104d32;
                this->transform_index = local_5c;
                piVar9 = (local_50->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                piVar10 = (local_50->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                lspec = local_50;
              }
              local_38 = (ulong)((int)local_38 + 1);
            } while (local_38 < (ulong)((long)piVar10 - (long)piVar9 >> 2));
          }
          goto LAB_00105037;
        }
      }
      __k = &local_70;
      local_70 = (ulong)this->num_vars_exp;
      iVar8 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_kitty::detail::spectrum>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->specs)._M_h,__k);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_unsigned_long,_kitty::detail::spectrum>,_false>.
          _M_cur == (__node_type *)0x0) {
LAB_00105048:
        this_00 = "_Map_base::at";
        std::__throw_out_of_range("_Map_base::at");
        psVar2 = (((vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
                    *)this_00)->
                 super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        psVar3 = (((vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
                    *)this_00)->
                 super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        lVar11 = (long)psVar3 - (long)psVar2 >> 1;
        bVar18 = __k < (key_type *)(lVar11 * -0x5555555555555555);
        __n = (pointer)((long)__k + lVar11 * 0x5555555555555555);
        if (bVar18 || __n == (pointer)0x0) {
          if ((bVar18) && (__n = psVar2 + (long)__k, psVar3 != __n)) {
            (((vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
               *)this_00)->
            super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
            )._M_impl.super__Vector_impl_data._M_finish = __n;
          }
          return SUB81(__n,0);
        }
        std::
        vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
        ::_M_default_append((vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
                             *)this_00,(size_type)__n);
        return (bool)extraout_AL;
      }
      psVar15 = (spectrum *)
                ((long)iVar8.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_kitty::detail::spectrum>,_false>
                       ._M_cur + 0x10);
      if (psVar15 != local_50) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)psVar15,&local_50->_s);
      }
      bVar18 = normalize_rec(this,psVar15,this->num_vars_exp);
      if (!bVar18) goto LAB_00104d32;
    }
LAB_00105037:
    bVar18 = true;
  }
  return bVar18;
}

Assistant:

bool normalize_rec( spectrum& lspec, unsigned v )
  {
    if ( ++step_counter == step_limit )
      return false;

    if ( v == num_vars_exp ) /* leaf case */
    {
      /* invert function if necessary */
      if ( hasOutputNegation && lspec[0u] < 0 )
      {
        insert( lspec.output_negation() );
      }
      /* invert any variable as necessary */
      if ( hasInputNegation )
      {
        for ( auto i = 1u; i < num_vars_exp; i <<= 1 )
        {
          if ( lspec[i] < 0 )
          {
            insert( lspec.input_negation( i ) );
          }
        }
      }

      closer( lspec );
      return true;
    }

    auto min = 0, max = 0;
    const auto p = std::accumulate( lspec.cbegin() + v, lspec.cend(),
                                    std::make_pair( min, max ),
                                    []( auto a, auto sv )
                                    {
                                      return std::make_pair( std::min( a.first, abs( sv ) ), std::max( a.second, abs( sv ) ) );
                                    } );
    min = p.first;
    max = p.second;

    if ( max == 0 )
    {
      auto& spec2 = specs.at( num_vars_exp );
      spec2 = lspec;
      if ( !normalize_rec( spec2, num_vars_exp ) )
        return false;
    }
    else
    {
      for ( auto i = 1u; i < lspec.size(); ++i )
      {
        auto j = order[i];
        if ( abs( lspec[j] ) != max )
        {
          continue;
        }

        /* k = first one bit in j starting from pos v */
        auto k = j & ~( v - 1 ); /* remove 1 bits until v */
        if ( k == 0 )
        {
          continue; /* are there bit left? */
        }
        k = k - ( k & ( k - 1 ) ); /* extract lowest bit */
        j ^= k;                    /* remove bit k from j */

        auto& spec2 = specs.at( v << 1 );
        spec2 = lspec;

        const auto save = transform_index;

        /* spectral translation to all other 1s in j */
        while ( j )
        {
          auto p = j - ( j & ( j - 1 ) );
          insert( spec2.spectral_translation( k, p ) );
          j ^= p;
        }

        if ( k != v )
        {
          insert( spec2.permutation( k, v ) );
        }

        if ( !normalize_rec( spec2, v << 1 ) )
          return false;

        if ( v == 1 && min == max )
        {
          return true;
        }
        transform_index = save;
      }
    }

    return true;
  }